

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O1

CURLcode cf_setup_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint uVar1;
  uint *puVar2;
  Curl_cfilter *cf_00;
  connectdata *conn;
  undefined8 uVar3;
  curl_trc_feat *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  long lVar7;
  uint *ctx;
  undefined7 in_register_00000011;
  Curl_cfilter *local_48;
  undefined4 local_3c;
  _Bool *local_38;
  
  local_3c = (undefined4)CONCAT71(in_register_00000011,blocking);
  if ((cf->field_0x24 & 1) == 0) {
    puVar2 = (uint *)cf->ctx;
    local_38 = done;
LAB_0011c7f9:
    cf_00 = cf->next;
    if ((cf_00 != (Curl_cfilter *)0x0) && ((cf_00->field_0x24 & 1) == 0)) {
      CVar6 = Curl_conn_cf_connect(cf_00,data,local_3c._0_1_,done);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      if (*done != true) {
        return CURLE_OK;
      }
    }
    if (*puVar2 == 0) {
      uVar3 = *(undefined8 *)(puVar2 + 2);
      uVar1 = puVar2[5];
      lVar7 = 8;
      do {
        if (*(uint *)((long)&__do_global_dtors_aux_fini_array_entry + lVar7) == uVar1) {
          lVar7 = *(long *)((long)&transport_providers[0].transport + lVar7);
          goto LAB_0011c9d6;
        }
        lVar7 = lVar7 + 0x10;
      } while (lVar7 != 0x38);
      lVar7 = 0;
LAB_0011c9d6:
      if (lVar7 == 0) {
        CVar6 = CURLE_UNSUPPORTED_PROTOCOL;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
          pcVar4 = (data->state).feat;
          if (pcVar4 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011cae3;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar4->log_level)) {
LAB_0011cae3:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"unsupported transport type %d",(ulong)uVar1);
            }
          }
        }
      }
      else {
        local_48 = (Curl_cfilter *)0x0;
        ctx = (uint *)(*Curl_ccalloc)(1,0x48);
        if (ctx == (uint *)0x0) {
          CVar6 = CURLE_OUT_OF_MEMORY;
        }
        else {
          *ctx = uVar1;
          *(long *)(ctx + 2) = lVar7;
          *(undefined8 *)(ctx + 4) = uVar3;
          CVar6 = Curl_cf_create(&local_48,&Curl_cft_happy_eyeballs,ctx);
        }
        if (CVar6 == CURLE_OK) {
          Curl_conn_cf_insert_after(cf,local_48);
          CVar6 = CURLE_OK;
          done = local_38;
        }
        else {
          (*Curl_cfree)(local_48);
          local_48 = (Curl_cfilter *)0x0;
          (*Curl_cfree)(ctx);
          done = local_38;
        }
      }
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      *puVar2 = 1;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_0011c7f9;
    }
    if ((*puVar2 < 2) && (((ulong)cf->conn->bits & 2) != 0)) {
      CVar6 = Curl_cf_socks_proxy_insert_after(cf,data);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      *puVar2 = 2;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_0011c7f9;
    }
    if ((*puVar2 < 3) && (conn = cf->conn, ((ulong)conn->bits & 1) != 0)) {
      if (((((conn->http_proxy).proxytype & 0xfe) == 2) &&
          (_Var5 = Curl_conn_is_ssl(conn,cf->sockindex), !_Var5)) &&
         (CVar6 = Curl_cf_ssl_proxy_insert_after(cf,data), CVar6 != CURLE_OK)) {
        return CVar6;
      }
      if ((((ulong)cf->conn->bits & 8) != 0) &&
         (CVar6 = Curl_cf_http_proxy_insert_after(cf,data), CVar6 != CURLE_OK)) {
        return CVar6;
      }
      *puVar2 = 3;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_0011c7f9;
    }
    if (*puVar2 < 4) {
      if (((data->set).field_0x8cf & 0x20) != 0) {
        _Var5 = Curl_conn_is_ssl(cf->conn,cf->sockindex);
        if (_Var5) {
          Curl_failf(data,"haproxy protocol not support with SSL encryption in place (QUIC?)");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        CVar6 = Curl_cf_haproxy_insert_after(cf,data);
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
      }
      *puVar2 = 4;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_0011c7f9;
    }
    if (4 < *puVar2) goto LAB_0011cb11;
    if ((puVar2[4] != 0) &&
       ((((puVar2[4] == 1 || ((cf->conn->handler->flags & 1) != 0)) &&
         (_Var5 = Curl_conn_is_ssl(cf->conn,cf->sockindex), !_Var5)) &&
        (CVar6 = Curl_cf_ssl_insert_after(cf,data), CVar6 != CURLE_OK)))) {
      return CVar6;
    }
    *puVar2 = 5;
    if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_0011c7f9;
LAB_0011cb11:
    *puVar2 = 6;
    cf->field_0x24 = cf->field_0x24 | 1;
  }
  *done = true;
  return CURLE_OK;
}

Assistant:

static CURLcode cf_setup_connect(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool blocking, bool *done)
{
  struct cf_setup_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* connect current sub-chain */
connect_sub_chain:
  if(cf->next && !cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  if(ctx->state < CF_SETUP_CNNCT_EYEBALLS) {
    result = cf_he_insert_after(cf, data, ctx->remotehost, ctx->transport);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_EYEBALLS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  /* sub-chain connected, do we need to add more? */
#ifndef CURL_DISABLE_PROXY
  if(ctx->state < CF_SETUP_CNNCT_SOCKS && cf->conn->bits.socksproxy) {
    result = Curl_cf_socks_proxy_insert_after(cf, data);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_SOCKS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_HTTP_PROXY && cf->conn->bits.httpproxy) {
#ifdef USE_SSL
    if(IS_HTTPS_PROXY(cf->conn->http_proxy.proxytype)
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
      result = Curl_cf_ssl_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */

#if !defined(CURL_DISABLE_HTTP)
    if(cf->conn->bits.tunnel_proxy) {
      result = Curl_cf_http_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_HTTP */
    ctx->state = CF_SETUP_CNNCT_HTTP_PROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }
#endif /* !CURL_DISABLE_PROXY */

  if(ctx->state < CF_SETUP_CNNCT_HAPROXY) {
#if !defined(CURL_DISABLE_PROXY)
    if(data->set.haproxyprotocol) {
      if(Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
        failf(data, "haproxy protocol not support with SSL "
              "encryption in place (QUIC?)");
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      result = Curl_cf_haproxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_PROXY */
    ctx->state = CF_SETUP_CNNCT_HAPROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_SSL) {
#ifdef USE_SSL
    if((ctx->ssl_mode == CURL_CF_SSL_ENABLE
        || (ctx->ssl_mode != CURL_CF_SSL_DISABLE
           && cf->conn->handler->flags & PROTOPT_SSL)) /* we want SSL */
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) { /* it is missing */
      result = Curl_cf_ssl_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */
    ctx->state = CF_SETUP_CNNCT_SSL;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  ctx->state = CF_SETUP_DONE;
  cf->connected = TRUE;
  *done = TRUE;
  return CURLE_OK;
}